

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ExpandDimsLayerParams::~ExpandDimsLayerParams(ExpandDimsLayerParams *this)

{
  ~ExpandDimsLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ExpandDimsLayerParams::~ExpandDimsLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ExpandDimsLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}